

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

void sptk::world::cftb1st(int n,double *a,double *w)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  
  iVar8 = n >> 3;
  lVar4 = (long)(iVar8 * 2);
  dVar24 = a[lVar4];
  dVar26 = (a + lVar4)[1];
  dVar39 = a[iVar8 * 6];
  dVar21 = (a + iVar8 * 6)[1];
  dVar16 = dVar24 - dVar39;
  dVar17 = dVar26 - dVar21;
  dVar19 = a[iVar8 * 4];
  dVar18 = (a + iVar8 * 4)[1];
  dVar20 = *a + dVar19;
  dVar30 = -a[1] - dVar18;
  dVar18 = dVar18 - a[1];
  dVar19 = *a - dVar19;
  dVar24 = dVar24 + dVar39;
  dVar26 = dVar26 + dVar21;
  *a = dVar20 + dVar24;
  a[1] = dVar30 - dVar26;
  a[lVar4] = dVar20 - dVar24;
  (a + lVar4)[1] = dVar30 + dVar26;
  a[iVar8 * 4] = dVar19 + dVar17;
  (a + iVar8 * 4)[1] = dVar18 + dVar16;
  a[iVar8 * 6] = dVar19 - dVar17;
  (a + iVar8 * 6)[1] = dVar18 - dVar16;
  dVar24 = w[1];
  dVar26 = w[2];
  dVar39 = w[3];
  lVar3 = (long)(iVar8 + -2);
  lVar9 = lVar4 * 0x18;
  lVar11 = lVar4 << 4;
  lVar15 = 0;
  dVar21 = 0.0;
  dVar19 = 0.0;
  dVar18 = 1.0;
  dVar16 = 1.0;
  lVar5 = lVar4 * 4;
  lVar6 = lVar4;
  lVar10 = lVar4 * 2;
  lVar2 = lVar9;
  while( true ) {
    lVar14 = lVar2 + -0x20;
    lVar13 = lVar10 + -4;
    lVar12 = lVar6 + -4;
    lVar7 = lVar5 + -4;
    if (lVar3 <= lVar15 + 2) break;
    dVar17 = w[lVar15 + 6];
    dVar41 = (dVar18 + dVar17) * dVar39;
    dVar18 = w[lVar15 + 7];
    dVar37 = (dVar19 + dVar18) * dVar39;
    dVar19 = *(double *)((long)a + lVar11 + 0x10);
    dVar20 = *(double *)((long)a + lVar11 + 0x18);
    dVar34 = -a[lVar15 + 3] - dVar20;
    dVar28 = a[lVar15 + 2] + dVar19;
    dVar20 = dVar20 - a[lVar15 + 3];
    dVar19 = a[lVar15 + 2] - dVar19;
    dVar35 = a[lVar4 + 2];
    dVar36 = (a + lVar4 + 2)[1];
    pdVar1 = (double *)((long)a + lVar9 + 0x10);
    dVar30 = *pdVar1;
    dVar42 = pdVar1[1];
    dVar31 = dVar35 + dVar30;
    dVar33 = dVar36 + dVar42;
    dVar35 = dVar35 - dVar30;
    dVar36 = dVar36 - dVar42;
    dVar38 = dVar20 - dVar35;
    dVar40 = dVar19 - dVar36;
    dVar30 = *(double *)((long)a + lVar11 + 0x28);
    dVar25 = -a[lVar15 + 5] - dVar30;
    dVar42 = *(double *)((long)a + lVar11 + 0x20);
    dVar27 = a[lVar15 + 4] + dVar42;
    dVar30 = dVar30 - a[lVar15 + 5];
    dVar42 = a[lVar15 + 4] - dVar42;
    dVar22 = a[lVar4 + 4];
    dVar23 = (a + lVar4 + 4)[1];
    pdVar1 = (double *)((long)a + lVar9 + 0x20);
    dVar29 = *pdVar1;
    dVar32 = pdVar1[1];
    dVar43 = dVar22 + dVar29;
    dVar44 = dVar23 + dVar32;
    dVar22 = dVar22 - dVar29;
    dVar23 = dVar23 - dVar32;
    dVar29 = w[lVar15 + 4];
    dVar32 = w[lVar15 + 5];
    a[lVar15 + 2] = dVar28 + dVar31;
    a[lVar15 + 3] = dVar34 - dVar33;
    a[lVar15 + 4] = dVar27 + dVar43;
    a[lVar15 + 5] = dVar25 - dVar44;
    a[lVar4 + 2] = dVar28 - dVar31;
    dVar28 = (dVar16 + dVar29) * dVar26;
    dVar31 = (dVar21 + dVar32) * dVar26;
    a[lVar4 + 3] = dVar33 + dVar34;
    a[lVar4 + 4] = dVar27 - dVar43;
    a[lVar4 + 5] = dVar44 + dVar25;
    dVar35 = dVar35 + dVar20;
    dVar36 = dVar36 + dVar19;
    pdVar1 = (double *)((long)a + lVar11 + 0x10);
    *pdVar1 = dVar36 * dVar28 + -dVar31 * dVar35;
    pdVar1[1] = dVar35 * dVar28 + dVar31 * dVar36;
    dVar21 = dVar30 + dVar22;
    dVar19 = dVar42 + dVar23;
    pdVar1 = (double *)((long)a + lVar11 + 0x20);
    *pdVar1 = dVar19 * dVar29 + -dVar32 * dVar21;
    pdVar1[1] = dVar21 * dVar29 + dVar32 * dVar19;
    pdVar1 = (double *)((long)a + lVar9 + 0x10);
    *pdVar1 = dVar40 * dVar41 + dVar37 * dVar38;
    pdVar1[1] = dVar38 * dVar41 + -dVar37 * dVar40;
    dVar30 = dVar30 - dVar22;
    dVar42 = dVar42 - dVar23;
    pdVar1 = (double *)((long)a + lVar9 + 0x20);
    *pdVar1 = dVar42 * dVar17 + dVar18 * dVar30;
    pdVar1[1] = dVar30 * dVar17 + -dVar18 * dVar42;
    dVar21 = *(double *)((long)a + lVar2 + -0x18);
    dVar33 = -a[lVar6 + -3] - dVar21;
    dVar27 = a[lVar12] + *(double *)((long)a + lVar14);
    dVar21 = dVar21 - a[lVar6 + -3];
    dVar23 = a[lVar12] - *(double *)((long)a + lVar14);
    dVar20 = a[lVar13];
    dVar30 = (a + lVar13)[1];
    dVar19 = a[lVar7];
    dVar16 = (a + lVar7)[1];
    dVar38 = dVar20 + dVar19;
    dVar40 = dVar30 + dVar16;
    dVar20 = dVar20 - dVar19;
    dVar30 = dVar30 - dVar16;
    dVar19 = *(double *)((long)a + lVar2 + -8);
    dVar25 = -a[lVar6 + -1] - dVar19;
    dVar16 = *(double *)((long)a + lVar2 + -0x10);
    dVar34 = a[lVar6 + -2] + dVar16;
    dVar19 = dVar19 - a[lVar6 + -1];
    dVar16 = a[lVar6 + -2] - dVar16;
    dVar42 = a[lVar10 + -2];
    dVar35 = (a + lVar10 + -2)[1];
    dVar36 = a[lVar5 + -2];
    dVar22 = (a + lVar5 + -2)[1];
    dVar43 = dVar42 + dVar36;
    dVar44 = dVar35 + dVar22;
    dVar42 = dVar42 - dVar36;
    dVar35 = dVar35 - dVar22;
    a[lVar6 + -2] = dVar34 + dVar43;
    a[lVar6 + -1] = dVar25 - dVar44;
    a[lVar12] = dVar27 + dVar38;
    a[lVar6 + -3] = dVar33 - dVar40;
    a[lVar10 + -2] = dVar34 - dVar43;
    a[lVar10 + -1] = dVar44 + dVar25;
    a[lVar13] = dVar27 - dVar38;
    a[lVar10 + -3] = dVar40 + dVar33;
    dVar36 = dVar19 - dVar42;
    dVar22 = dVar16 - dVar35;
    dVar42 = dVar42 + dVar19;
    dVar35 = dVar35 + dVar16;
    pdVar1 = (double *)((long)a + lVar2 + -0x10);
    *pdVar1 = dVar35 * dVar31 + -dVar28 * dVar42;
    pdVar1[1] = dVar42 * dVar31 + dVar28 * dVar35;
    dVar19 = dVar21 + dVar20;
    dVar16 = dVar23 + dVar30;
    *(double *)((long)a + lVar14) = dVar16 * dVar32 + -dVar29 * dVar19;
    ((double *)((long)a + lVar14))[1] = dVar19 * dVar32 + dVar29 * dVar16;
    a[lVar5 + -2] = dVar22 * dVar37 + dVar41 * dVar36;
    (a + lVar5 + -2)[1] = dVar36 * dVar37 + -dVar41 * dVar22;
    dVar21 = dVar21 - dVar20;
    dVar23 = dVar23 - dVar30;
    a[lVar7] = dVar23 * dVar18 + dVar17 * dVar21;
    (a + lVar7)[1] = dVar21 * dVar18 + -dVar17 * dVar23;
    lVar15 = lVar15 + 4;
    lVar4 = lVar4 + 4;
    lVar9 = lVar9 + 0x20;
    lVar11 = lVar11 + 0x20;
    dVar21 = dVar32;
    dVar19 = dVar18;
    dVar18 = dVar17;
    dVar16 = dVar29;
    lVar5 = lVar7;
    lVar6 = lVar12;
    lVar10 = lVar13;
    lVar2 = lVar14;
  }
  dVar36 = (dVar16 + dVar24) * dVar26;
  dVar26 = (dVar21 + dVar24) * dVar26;
  dVar35 = (dVar18 - dVar24) * dVar39;
  dVar39 = (dVar19 - dVar24) * dVar39;
  lVar6 = (long)(iVar8 * 5);
  dVar32 = -a[(long)iVar8 + -1] - a[lVar6 + -1];
  lVar10 = (long)(iVar8 * 3);
  lVar5 = (long)(iVar8 * 7);
  dVar29 = a[lVar3] + a[lVar6 + -2];
  dVar30 = a[lVar6 + -1] - a[(long)iVar8 + -1];
  dVar42 = a[lVar3] - a[lVar6 + -2];
  dVar21 = a[lVar10 + -2];
  dVar19 = (a + lVar10 + -2)[1];
  dVar18 = a[lVar5 + -2];
  dVar16 = (a + lVar5 + -2)[1];
  dVar17 = dVar21 + dVar18;
  dVar20 = dVar19 + dVar16;
  dVar21 = dVar21 - dVar18;
  dVar19 = dVar19 - dVar16;
  a[lVar3] = dVar29 + dVar17;
  a[(long)iVar8 + -1] = dVar32 - dVar20;
  a[lVar10 + -2] = dVar29 - dVar17;
  a[lVar10 + -1] = dVar20 + dVar32;
  dVar18 = dVar30 + dVar21;
  dVar16 = dVar42 + dVar19;
  a[lVar6 + -2] = dVar16 * dVar36 + -dVar26 * dVar18;
  (a + lVar6 + -2)[1] = dVar18 * dVar36 + dVar26 * dVar16;
  dVar30 = dVar30 - dVar21;
  dVar42 = dVar42 - dVar19;
  a[lVar5 + -2] = dVar42 * dVar35 + dVar39 * dVar30;
  (a + lVar5 + -2)[1] = dVar30 * dVar35 + -dVar39 * dVar42;
  dVar21 = a[iVar8] + a[lVar6];
  dVar18 = -a[(long)iVar8 + 1] - a[lVar6 + 1];
  dVar16 = a[iVar8] - a[lVar6];
  dVar17 = a[lVar6 + 1] - a[(long)iVar8 + 1];
  dVar30 = a[lVar10] + a[lVar5];
  dVar42 = a[lVar10 + 1] + a[lVar5 + 1];
  dVar19 = a[lVar10] - a[lVar5];
  dVar20 = a[lVar10 + 1] - a[lVar5 + 1];
  a[iVar8] = dVar21 + dVar30;
  a[(long)iVar8 + 1] = dVar18 - dVar42;
  a[lVar10] = dVar21 - dVar30;
  a[lVar10 + 1] = dVar42 + dVar18;
  dVar21 = dVar16 + dVar20;
  dVar18 = dVar17 + dVar19;
  a[lVar6] = (dVar21 - dVar18) * dVar24;
  a[lVar6 + 1] = (dVar18 + dVar21) * dVar24;
  dVar16 = dVar16 - dVar20;
  dVar17 = dVar17 - dVar19;
  a[lVar5] = (dVar17 + dVar16) * -dVar24;
  a[lVar5 + 1] = (dVar17 - dVar16) * -dVar24;
  dVar29 = -a[(long)iVar8 + 3] - a[lVar6 + 3];
  dVar42 = a[(long)iVar8 + 2] + a[lVar6 + 2];
  dVar20 = a[lVar6 + 3] - a[(long)iVar8 + 3];
  dVar30 = a[(long)iVar8 + 2] - a[lVar6 + 2];
  dVar24 = a[lVar10 + 2];
  dVar21 = (a + lVar10 + 2)[1];
  dVar19 = a[lVar5 + 2];
  dVar18 = (a + lVar5 + 2)[1];
  dVar16 = dVar24 + dVar19;
  dVar17 = dVar21 + dVar18;
  dVar24 = dVar24 - dVar19;
  dVar21 = dVar21 - dVar18;
  a[(long)iVar8 + 2] = dVar42 + dVar16;
  a[(long)iVar8 + 3] = dVar29 - dVar17;
  a[lVar10 + 2] = dVar42 - dVar16;
  a[lVar10 + 3] = dVar17 + dVar29;
  dVar19 = dVar20 + dVar24;
  dVar18 = dVar30 + dVar21;
  a[lVar6 + 2] = dVar18 * dVar26 + -dVar36 * dVar19;
  (a + lVar6 + 2)[1] = dVar19 * dVar26 + dVar36 * dVar18;
  dVar20 = dVar20 - dVar24;
  dVar30 = dVar30 - dVar21;
  a[lVar5 + 2] = dVar30 * dVar39 + dVar35 * dVar20;
  (a + lVar5 + 2)[1] = dVar20 * dVar39 + -dVar35 * dVar30;
  return;
}

Assistant:

void cftb1st(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, csc1, csc3, wk1r, wk1i, wk3r, wk3i,
    wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = -a[1] - a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = -a[1] + a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i - x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i + x2i;
  a[j2] = x1r + x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r - x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  csc1 = w[2];
  csc3 = w[3];
  wd1r = 1;
  wd1i = 0;
  wd3r = 1;
  wd3i = 0;
  k = 0;
  for (j = 2; j < mh - 2; j += 4) {
    k += 4;
    wk1r = csc1 * (wd1r + w[k]);
    wk1i = csc1 * (wd1i + w[k + 1]);
    wk3r = csc3 * (wd3r + w[k + 2]);
    wk3i = csc3 * (wd3i + w[k + 3]);
    wd1r = w[k];
    wd1i = w[k + 1];
    wd3r = w[k + 2];
    wd3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = -a[j + 1] - a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = -a[j + 1] + a[j2 + 1];
    y0r = a[j + 2] + a[j2 + 2];
    y0i = -a[j + 3] - a[j2 + 3];
    y1r = a[j + 2] - a[j2 + 2];
    y1i = -a[j + 3] + a[j2 + 3];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 + 2] + a[j3 + 2];
    y2i = a[j1 + 3] + a[j3 + 3];
    y3r = a[j1 + 2] - a[j3 + 2];
    y3i = a[j1 + 3] - a[j3 + 3];
    a[j] = x0r + x2r;
    a[j + 1] = x0i - x2i;
    a[j + 2] = y0r + y2r;
    a[j + 3] = y0i - y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    a[j1 + 2] = y0r - y2r;
    a[j1 + 3] = y0i + y2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = y1r + y3i;
    x0i = y1i + y3r;
    a[j2 + 2] = wd1r * x0r - wd1i * x0i;
    a[j2 + 3] = wd1r * x0i + wd1i * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    x0r = y1r - y3i;
    x0i = y1i - y3r;
    a[j3 + 2] = wd3r * x0r + wd3i * x0i;
    a[j3 + 3] = wd3r * x0i - wd3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = -a[j0 + 1] - a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = -a[j0 + 1] + a[j2 + 1];
    y0r = a[j0 - 2] + a[j2 - 2];
    y0i = -a[j0 - 1] - a[j2 - 1];
    y1r = a[j0 - 2] - a[j2 - 2];
    y1i = -a[j0 - 1] + a[j2 - 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 - 2] + a[j3 - 2];
    y2i = a[j1 - 1] + a[j3 - 1];
    y3r = a[j1 - 2] - a[j3 - 2];
    y3i = a[j1 - 1] - a[j3 - 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i - x2i;
    a[j0 - 2] = y0r + y2r;
    a[j0 - 1] = y0i - y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    a[j1 - 2] = y0r - y2r;
    a[j1 - 1] = y0i + y2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = y1r + y3i;
    x0i = y1i + y3r;
    a[j2 - 2] = wd1i * x0r - wd1r * x0i;
    a[j2 - 1] = wd1i * x0i + wd1r * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
    x0r = y1r - y3i;
    x0i = y1i - y3r;
    a[j3 - 2] = wd3i * x0r + wd3r * x0i;
    a[j3 - 1] = wd3i * x0i - wd3r * x0r;
  }
  wk1r = csc1 * (wd1r + wn4r);
  wk1i = csc1 * (wd1i + wn4r);
  wk3r = csc3 * (wd3r - wn4r);
  wk3i = csc3 * (wd3i - wn4r);
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0 - 2] + a[j2 - 2];
  x0i = -a[j0 - 1] - a[j2 - 1];
  x1r = a[j0 - 2] - a[j2 - 2];
  x1i = -a[j0 - 1] + a[j2 - 1];
  x2r = a[j1 - 2] + a[j3 - 2];
  x2i = a[j1 - 1] + a[j3 - 1];
  x3r = a[j1 - 2] - a[j3 - 2];
  x3i = a[j1 - 1] - a[j3 - 1];
  a[j0 - 2] = x0r + x2r;
  a[j0 - 1] = x0i - x2i;
  a[j1 - 2] = x0r - x2r;
  a[j1 - 1] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2 - 2] = wk1r * x0r - wk1i * x0i;
  a[j2 - 1] = wk1r * x0i + wk1i * x0r;
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3 - 2] = wk3r * x0r + wk3i * x0i;
  a[j3 - 1] = wk3r * x0i - wk3i * x0r;
  x0r = a[j0] + a[j2];
  x0i = -a[j0 + 1] - a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = -a[j0 + 1] + a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i - x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
  x0r = a[j0 + 2] + a[j2 + 2];
  x0i = -a[j0 + 3] - a[j2 + 3];
  x1r = a[j0 + 2] - a[j2 + 2];
  x1i = -a[j0 + 3] + a[j2 + 3];
  x2r = a[j1 + 2] + a[j3 + 2];
  x2i = a[j1 + 3] + a[j3 + 3];
  x3r = a[j1 + 2] - a[j3 + 2];
  x3i = a[j1 + 3] - a[j3 + 3];
  a[j0 + 2] = x0r + x2r;
  a[j0 + 3] = x0i - x2i;
  a[j1 + 2] = x0r - x2r;
  a[j1 + 3] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2 + 2] = wk1i * x0r - wk1r * x0i;
  a[j2 + 3] = wk1i * x0i + wk1r * x0r;
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3 + 2] = wk3i * x0r + wk3r * x0i;
  a[j3 + 3] = wk3i * x0i - wk3r * x0r;
}